

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O2

REF_STATUS
ref_collapse_edge_tri_quality(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  REF_INT cell;
  char *pcVar10;
  REF_DBL area;
  REF_DBL quality;
  REF_INT nodes [27];
  
  ref_node = ref_grid->node;
  *allowed = 0;
  ref_cell = ref_grid->cell[3];
  uVar8 = 0xffffffff;
  cell = -1;
  if (-1 < node1) {
    pRVar1 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    cell = -1;
    if (node1 < pRVar1->nnode) {
      uVar4 = pRVar1->first[(uint)node1];
      uVar8 = 0xffffffff;
      cell = -1;
      if ((long)(int)uVar4 != -1) {
        cell = pRVar1->item[(int)uVar4].ref;
        uVar8 = (ulong)uVar4;
      }
    }
  }
  while( true ) {
    if ((int)uVar8 == -1) {
      *allowed = 1;
      return 0;
    }
    uVar4 = ref_cell_nodes(ref_cell,cell,nodes);
    if (uVar4 != 0) break;
    uVar4 = ref_cell->node_per;
    uVar5 = 0;
    uVar7 = 0;
    if (0 < (int)uVar4) {
      uVar7 = (ulong)uVar4;
    }
    bVar3 = false;
    for (; uVar7 != uVar5; uVar5 = uVar5 + 1) {
      if (nodes[uVar5] == node0) {
        bVar3 = true;
      }
    }
    if (!bVar3) {
      for (lVar6 = 0; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
        if (nodes[lVar6] == node1) {
          nodes[lVar6] = node0;
        }
      }
      uVar4 = ref_node_tri_quality(ref_node,nodes,&quality);
      if (uVar4 != 0) {
        pcVar10 = "qual";
        uVar9 = 0x330;
        goto LAB_0014b8b6;
      }
      if (quality < ref_grid->adapt->collapse_quality_absolute) {
        return 0;
      }
      uVar4 = ref_node_tri_area(ref_node,nodes,&area);
      if (uVar4 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",
               0x335,"ref_collapse_edge_tri_quality",(ulong)uVar4,"vol");
        return uVar4;
      }
      if (area <= ref_node->min_volume) {
        return 0;
      }
    }
    pRVar2 = ref_cell->ref_adj->item;
    uVar8 = (ulong)pRVar2[(int)uVar8].next;
    cell = -1;
    if (uVar8 != 0xffffffffffffffff) {
      cell = pRVar2[uVar8].ref;
    }
  }
  pcVar10 = "nodes";
  uVar9 = 0x324;
LAB_0014b8b6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c",uVar9,
         "ref_collapse_edge_tri_quality",(ulong)uVar4,pcVar10);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_tri_quality(REF_GRID ref_grid,
                                                 REF_INT node0, REF_INT node1,
                                                 REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node;
  REF_DBL quality, area;
  REF_BOOL will_be_collapsed;

  *allowed = REF_FALSE;

  ref_cell = ref_grid_tri(ref_grid);

  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");

    will_be_collapsed = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (node0 == nodes[node]) {
        will_be_collapsed = REF_TRUE;
      }
    }
    if (will_be_collapsed) continue;

    for (node = 0; node < ref_cell_node_per(ref_cell); node++)
      if (node1 == nodes[node]) nodes[node] = node0;
    RSS(ref_node_tri_quality(ref_node, nodes, &quality), "qual");
    if (quality < ref_grid_adapt(ref_grid, collapse_quality_absolute))
      return REF_SUCCESS;

    /* for twod, should not hurt 3D */
    RSS(ref_node_tri_area(ref_node, nodes, &area), "vol");
    if (area <= ref_node_min_volume(ref_node)) return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}